

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

void __thiscall
TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test::testBody
          (TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test *this)

{
  pair<int,_int> pVar1;
  UtestShell *pUVar2;
  pair<int,_int> pVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 *this_00;
  int value;
  SimpleString local_48;
  SimpleString local_40;
  TestTerminatorWithoutExceptions local_38;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8;
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
  value = (int)&local_48;
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc0,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc0);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc0,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
  if (pVar1.second == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc1,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc1);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc1,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc2,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc2);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc2,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xfa000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc3,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc3);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc3,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc4,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc4);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc4,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xfa000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc5,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc5);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc5,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc6,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc6);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc6,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xfa000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,199,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,199);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,5,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,199,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
  if (pVar1.first == 3000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc9,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc9);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc9,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x177000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xca,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xca);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,6,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xca,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
  if (pVar1.first == 3000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcb,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcb);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcb,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x177000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcc,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcc);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,7,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcc,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
  if (pVar1.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xce,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xce);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xce,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x1f4000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcf,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcf);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,8,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcf,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
  if (pVar1.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd0,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd0);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd0,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x1f4000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd1,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd1);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,9,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd1,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
  if (pVar1.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd2,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd2);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd2,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x1f4000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd3,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd3);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,10,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd3,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
  if (pVar1.first == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd5,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd5);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd5,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x2ee000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd6,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd6);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xb,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd6,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
  if (pVar1.first == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd7,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd7);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd7,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x2ee000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd8,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd8);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xc,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd8,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
  if (pVar1.first == 8000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xda,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xda);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xda,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x3e8000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xdb,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xdb);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,0xd,0);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xdb,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(3, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 40).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 40).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(5, 0).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(5, 0).second);

	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(6, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(6, 0).second);
	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(7, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(7, 0).second);

	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(8, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(8, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(9, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(9, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(10, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(10, 0).second);

	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(11, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(11, 0).second);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(12, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(12, 0).second);

	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(13, 0).first);
	CHECK_EQUAL(16000, t.nonDealerSelfDrawn(13, 0).second);
}